

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O2

void __thiscall
CombinedSeismogramm<float,_2>::AddComponent
          (CombinedSeismogramm<float,_2> *this,string *path,
          ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *getter)

{
  ComponentInfo CStack_38;
  
  ComponentInfo::ComponentInfo(&CStack_38,path,getter);
  std::
  vector<CombinedSeismogramm<float,2>::ComponentInfo,std::allocator<CombinedSeismogramm<float,2>::ComponentInfo>>
  ::emplace_back<CombinedSeismogramm<float,2>::ComponentInfo>
            ((vector<CombinedSeismogramm<float,2>::ComponentInfo,std::allocator<CombinedSeismogramm<float,2>::ComponentInfo>>
              *)&this->componentInfos,&CStack_38);
  std::__cxx11::string::~string((string *)&CStack_38);
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::AddComponent(const std::string& path, ValueGetter<Elastic, dims>* getter)
{
    componentInfos.push_back(ComponentInfo(path, getter));
}